

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_stream.cpp
# Opt level: O0

void __thiscall cppnet::LogStream::~LogStream(LogStream *this)

{
  bool bVar1;
  shared_ptr<cppnet::Log> local_20;
  LogStream *local_10;
  LogStream *this_local;
  
  local_10 = this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  if ((bVar1) &&
     (bVar1 = std::function::operator_cast_to_bool((function *)&this->_call_back), bVar1)) {
    std::shared_ptr<cppnet::Log>::shared_ptr(&local_20,&this->_log);
    std::function<void_(std::shared_ptr<cppnet::Log>)>::operator()(&this->_call_back,&local_20);
    std::shared_ptr<cppnet::Log>::~shared_ptr(&local_20);
  }
  std::function<void_(std::shared_ptr<cppnet::Log>)>::~function(&this->_call_back);
  std::shared_ptr<cppnet::Log>::~shared_ptr(&this->_log);
  return;
}

Assistant:

LogStream::~LogStream() {
    if (_log && _call_back) {
        _call_back(_log);
    }
}